

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall
Minisat::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int,_int> *map,Var_conflict *max)

{
  bool bVar1;
  Var_conflict VVar2;
  char *pcVar3;
  int i;
  ulong uVar4;
  lbool local_41;
  vec<int,_int> *local_40;
  Var_conflict *local_38;
  
  local_40 = map;
  local_38 = max;
  bVar1 = satisfied(this,c);
  if (!bVar1) {
    for (uVar4 = 0; uVar4 < (uint)c->header >> 5; uVar4 = uVar4 + 1) {
      local_41.value =
           SUB41(c[uVar4 + 1].header,0) & 1 ^
           (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
           [(int)c[uVar4 + 1].header >> 1].value;
      bVar1 = lbool::operator!=(&local_41,l_False);
      if (bVar1) {
        pcVar3 = "-";
        if (((uint)c[uVar4 + 1].header & 1) == 0) {
          pcVar3 = "";
        }
        VVar2 = mapVar((int)c[uVar4 + 1].header >> 1,local_40,local_38);
        fprintf((FILE *)f,"%s%d ",pcVar3,(ulong)(VVar2 + 1));
      }
    }
    fwrite("0\n",2,1,(FILE *)f);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, Clause& c, vec<Var>& map, Var& max)
{
    if (satisfied(c)) return;

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max)+1);
    fprintf(f, "0\n");
}